

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorOutput.h
# Opt level: O2

void __thiscall DetectorOutput::DetectorOutput(DetectorOutput *this,char *detector)

{
  unique_ptr<Detector,_std::default_delete<Detector>_> *puVar1;
  element_type *peVar2;
  Detector *pDVar3;
  int iVar4;
  undefined4 extraout_var;
  Detector *pDVar5;
  runtime_error *prVar6;
  shared_ptr<util::LibraryLoader> sVar7;
  char *_argv;
  
  (this->tls)._M_h._M_buckets = &(this->tls)._M_h._M_single_bucket;
  (this->tls)._M_h._M_bucket_count = 1;
  (this->tls)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tls)._M_h._M_element_count = 0;
  (this->tls)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tls)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tls)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sVar7 = util::LibLoaderFactory::getLoader();
  (this->_det)._M_t.super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
  super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
  super__Head_base<0UL,_Detector_*,_false>._M_head_impl = (Detector *)0x0;
  puVar1 = &this->_det;
  peVar2 = (this->_libdetector).super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar4 = (*peVar2->_vptr_LibraryLoader[2])
                    (peVar2,detector,
                     sVar7.super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
  if ((char)iVar4 == '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"could not load library");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar2 = (this->_libdetector).super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar4 = (*peVar2->_vptr_LibraryLoader[5])(peVar2,"CreateDetector");
  if ((code *)CONCAT44(extraout_var,iVar4) != (code *)0x0) {
    pDVar5 = (Detector *)(*(code *)CONCAT44(extraout_var,iVar4))();
    pDVar3 = (puVar1->_M_t).super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
             super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
             super__Head_base<0UL,_Detector_*,_false>._M_head_impl;
    (puVar1->_M_t).super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
    super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
    super__Head_base<0UL,_Detector_*,_false>._M_head_impl = pDVar5;
    if (pDVar3 != (Detector *)0x0) {
      (**(code **)(*(long *)pDVar3 + 0x10))();
      pDVar5 = (puVar1->_M_t).super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
               super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
               super__Head_base<0UL,_Detector_*,_false>._M_head_impl;
    }
    _argv = "";
    (*(code *)**(undefined8 **)pDVar5)(pDVar5,1,&_argv,callback,0);
    std::operator<<((ostream *)&std::cout,"init_done\n");
    return;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"could not bind detector");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit DetectorOutput(const char* detector) {
    if (!_libdetector->load(detector)) {
      throw std::runtime_error("could not load library");
    }
    decltype(CreateDetector)* create_detector =
        (*_libdetector)["CreateDetector"];
    if (nullptr == create_detector) {
      throw std::runtime_error("could not bind detector");
    }
    _det = std::unique_ptr<Detector>(create_detector());

    const char* _argv = "";
    _det->init(1, &_argv, callback, nullptr);

    std::cout << "init_done\n";
  }